

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sessions.c
# Opt level: O0

int cueify_device_read_sessions(cueify_device *d,cueify_sessions *s)

{
  cueify_sessions_private *sessions;
  cueify_device_private *dev;
  cueify_sessions *s_local;
  cueify_device *d_local;
  
  if ((d == (cueify_device *)0x0) || (s == (cueify_sessions *)0x0)) {
    d_local._4_4_ = 3;
  }
  else {
    memset(s,0,0xc);
    d_local._4_4_ =
         cueify_device_read_sessions_unportable
                   ((cueify_device_private *)d,(cueify_sessions_private *)s);
  }
  return d_local._4_4_;
}

Assistant:

int cueify_device_read_sessions(cueify_device *d, cueify_sessions *s) {
    cueify_device_private *dev = (cueify_device_private *)d;
    cueify_sessions_private *sessions = (cueify_sessions_private *)s;

    if (d == NULL || s == NULL) {
	return CUEIFY_ERR_BADARG;
    }

    memset(sessions, 0, sizeof(cueify_sessions_private));

    return cueify_device_read_sessions_unportable(dev, sessions);
}